

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O0

string * google::protobuf::GetCapturedTestStdout_abi_cxx11_(void)

{
  int v1;
  int v2;
  char *pcVar1;
  LogMessage *pLVar2;
  string *in_RDI;
  LogMessage local_30;
  Voidify local_19;
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  string *result;
  
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(original_stdout_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(-1);
  local_18 = absl::lts_20250127::log_internal::Check_NEImpl(v1,v2,"original_stdout_ != -1");
  if (local_18 == (Nullable<const_char_*>)0x0) {
    close(1);
    dup2(original_stdout_,1);
    close(original_stdout_);
    original_stdout_ = 0xffffffff;
    std::__cxx11::string::string((string *)in_RDI);
    File::ReadFileToStringOrDie((string *)stdout_capture_filename__abi_cxx11_,in_RDI);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    remove(pcVar1);
    return in_RDI;
  }
  pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_18);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
             ,0xbc,pcVar1);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [15])"Not capturing.");
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

std::string GetCapturedTestStdout() {
  ABSL_CHECK_NE(original_stdout_, -1) << "Not capturing.";

  close(1);
  dup2(original_stdout_, 1);
  close(original_stdout_);
  original_stdout_ = -1;

  std::string result;
  File::ReadFileToStringOrDie(stdout_capture_filename_, &result);

  remove(stdout_capture_filename_.c_str());

  return result;
}